

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O3

LogStream *
Assimp::LogStream::createDefaultStream(aiDefaultLogStream streams,char *name,IOSystem *io)

{
  int iVar1;
  undefined4 extraout_var;
  LogStream *pLVar2;
  _func_int **pp_Var3;
  IOStream *pIVar4;
  DefaultIOSystem local_38;
  
  switch(streams) {
  case aiDefaultLogStream_FILE:
    if (name == (char *)0x0) {
      return (LogStream *)0x0;
    }
    if (*name == '\0') {
      return (LogStream *)0x0;
    }
    pLVar2 = (LogStream *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
    pLVar2->_vptr_LogStream = (_func_int **)&PTR__FileLogStream_0025b6f0;
    pLVar2[1]._vptr_LogStream = (_func_int **)0x0;
    if (*name == '\0') {
      return pLVar2;
    }
    if (io == (IOSystem *)0x0) {
      local_38.super_IOSystem.m_pathStack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.super_IOSystem.m_pathStack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.super_IOSystem.m_pathStack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38.super_IOSystem._vptr_IOSystem = (_func_int **)&PTR__IOSystem_0025bbb8;
      pIVar4 = DefaultIOSystem::Open(&local_38,name,"wt");
      pLVar2[1]._vptr_LogStream = (_func_int **)pIVar4;
      local_38.super_IOSystem._vptr_IOSystem = (_func_int **)&PTR__IOSystem_0025b4c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38.super_IOSystem.m_pathStack);
      return pLVar2;
    }
    iVar1 = (*io->_vptr_IOSystem[4])(io,name,"wt");
    pp_Var3 = (_func_int **)CONCAT44(extraout_var,iVar1);
    break;
  case aiDefaultLogStream_STDOUT:
    pLVar2 = (LogStream *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
    pLVar2->_vptr_LogStream = (_func_int **)&PTR__LogStream_0025b798;
    pp_Var3 = (_func_int **)&std::cout;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/DefaultLogger.cpp"
                  ,0x77,
                  "static LogStream *Assimp::LogStream::createDefaultStream(aiDefaultLogStream, const char *, IOSystem *)"
                 );
  case aiDefaultLogStream_STDERR:
    pLVar2 = (LogStream *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
    pLVar2->_vptr_LogStream = (_func_int **)&PTR__LogStream_0025b798;
    pp_Var3 = (_func_int **)&std::cerr;
    break;
  case aiDefaultLogStream_DEBUGGER:
    return (LogStream *)0x0;
  }
  pLVar2[1]._vptr_LogStream = pp_Var3;
  return pLVar2;
}

Assistant:

LogStream* LogStream::createDefaultStream(aiDefaultLogStream    streams,
    const char* name /*= "AssimpLog.txt"*/,
    IOSystem* io            /*= NULL*/)
{
    switch (streams)
    {
        // This is a platform-specific feature
    case aiDefaultLogStream_DEBUGGER:
#ifdef WIN32
        return new Win32DebugLogStream();
#else
        return nullptr;
#endif

        // Platform-independent default streams
    case aiDefaultLogStream_STDERR:
        return new StdOStreamLogStream(std::cerr);
    case aiDefaultLogStream_STDOUT:
        return new StdOStreamLogStream(std::cout);
    case aiDefaultLogStream_FILE:
        return (name && *name ? new FileLogStream(name,io) : nullptr );
    default:
        // We don't know this default log stream, so raise an assertion
        ai_assert(false);

    };

    // For compilers without dead code path detection
    return NULL;
}